

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O3

void dump_hex_script(envy_bios *bios,FILE *out,uint start,uint length)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int local_40;
  
  if (length != 0) {
    iVar1 = 0;
    do {
      uVar2 = 0x10;
      if (length < 0x10) {
        uVar2 = (ulong)length;
      }
      uVar5 = uVar2;
      uVar4 = start;
      if (iVar1 == 0) {
        fprintf((FILE *)out,"%04x:",(ulong)start);
      }
      else {
        fwrite("     ",5,1,(FILE *)out);
      }
      do {
        fprintf((FILE *)out," %02x",(ulong)bios->data[uVar4]);
        uVar5 = uVar5 - 1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != 0);
      local_40 = (int)uVar2;
      uVar4 = length - local_40;
      if (uVar4 == 0) {
        if (length < 0x10) {
          iVar3 = local_40 + -0x10;
          do {
            fwrite("   ",3,1,(FILE *)out);
            iVar3 = iVar3 + 1;
          } while (iVar3 != 0);
        }
        fwrite("  ",2,1,(FILE *)out);
      }
      else {
        fputc(10,(FILE *)out);
      }
      start = start + local_40;
      iVar1 = iVar1 + 1;
      length = uVar4;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void dump_hex_script (struct envy_bios *bios, FILE *out, unsigned int start, unsigned int length) {
	int cnt = 0;
	while (length) {
		unsigned int i, len = length;
		if (len > 16) len = 16;
		if (cnt)
			fprintf (out, "     ");
		else
			fprintf (out, "%04x:", start);
		for (i = 0; i < len; i++)
			fprintf(out, " %02x", bios->data[start+i]);
		start += len;
		length -= len;
		if (length) {
			fprintf(out, "\n");
		} else {
			while (len < 16) {
				fprintf(out, "   ");
				len++;
			}
			fprintf(out, "  ");
		}
		cnt++;
	}
}